

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void SstWriterClose(SstStream Stream)

{
  CPTimestepList *pp_Var1;
  StepRequest __ptr;
  NameListEntry *__ptr_00;
  uint uVar2;
  NameListEntry **ppNVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  NameListEntry **ppNVar10;
  long lVar11;
  int i;
  ulong uVar12;
  pthread_mutex_t *__mutex;
  CPTimestepList p_Var13;
  NameListEntry *Tmp;
  CPTimestepList *pp_Var14;
  int *local_c8;
  timeval CloseTime;
  uint local_68 [2];
  ReleaseRecPtr local_60;
  
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->CloseTimestepCount = Stream->WriterTimestep;
  if ((Stream->ConfigParams->StepDistributionMode != 2) ||
     (Stream->LastDemandTimestep == Stream->WriterTimestep)) {
    SendCloseMsgs(Stream);
  }
  pp_Var1 = &Stream->QueuedTimesteps;
  pp_Var14 = pp_Var1;
  while (p_Var13 = *pp_Var14, p_Var13 != (CPTimestepList)0x0) {
    if (p_Var13->PreciousTimestep != 0) {
      CP_verbose(Stream,TraceVerbose,"Precious Timestep %ld untagged, reference count is %d\n",
                 p_Var13->Timestep,(ulong)(uint)p_Var13->ReferenceCount);
      p_Var13->Expired = 1;
      p_Var13->PreciousTimestep = 0;
    }
    pp_Var14 = &p_Var13->Next;
  }
  Stream->ConfigParams->ReserveQueueLimit = 0;
  QueueMaintenance(Stream);
  usleep(100000);
  sVar8 = Stream->ConfigParams->CPCommPattern;
  if (sVar8 == 1) {
    if (0 < Stream->ReleaseCount) {
LAB_00113fc1:
      Stream->ReleaseCount = 0;
      free(Stream->ReleaseList);
      Stream->ReleaseList = (_ReleaseRec *)0x0;
    }
LAB_00114048:
    while( true ) {
      local_c8 = &Stream->ReleaseCount;
      __ptr = Stream->StepRequestQueue;
      if (__ptr == (StepRequest)0x0) break;
      Stream->StepRequestQueue = __ptr->Next;
      free(__ptr);
    }
    while (*pp_Var1 != (CPTimestepList)0x0) {
      CP_verbose(Stream,PerStepVerbose,"Waiting for timesteps to be released in WriterClose\n");
      if (4 < Stream->CPVerbosityLevel) {
        p_Var13 = *pp_Var1;
        pcVar5 = (char *)malloc(1);
        *pcVar5 = '\0';
        for (; p_Var13 != (CPTimestepList)0x0; p_Var13 = p_Var13->Next) {
          CP_verbose(Stream,TraceVerbose,
                     "IN TS WAIT, ENTRIES are Timestep %ld (exp %d, Prec %d, Ref %d), Count now %d\n"
                     ,p_Var13->Timestep,(ulong)(uint)p_Var13->Expired,
                     (ulong)(uint)p_Var13->PreciousTimestep,(ulong)(uint)p_Var13->ReferenceCount,
                     (ulong)(uint)Stream->QueuedTimestepCount);
          snprintf((char *)&CloseTime,0x1e,"%zd ",p_Var13->Timestep);
          sVar6 = strlen(pcVar5);
          sVar7 = strlen((char *)&CloseTime);
          pcVar5 = (char *)realloc(pcVar5,sVar6 + sVar7 + 1);
          strcat(pcVar5,(char *)&CloseTime);
        }
        CP_verbose(Stream,TraceVerbose,"The timesteps still queued are: %s\n",pcVar5);
        free(pcVar5);
      }
      CP_verbose(Stream,TraceVerbose,"Reader Count is %d\n");
      for (uVar12 = 0; (long)uVar12 < (long)Stream->ReaderCount; uVar12 = uVar12 + 1) {
        CP_verbose(Stream,TraceVerbose,"Reader [%d] status is %s\n",uVar12 & 0xffffffff,
                   SSTStreamStatusStr[Stream->Readers[uVar12]->ReaderStatus]);
      }
      pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
      if (Stream->ConfigParams->CPCommPattern == 0) {
        SMPI_Bcast(local_c8,1,SMPI_INT,0,Stream->mpiComm);
        if (0 < Stream->ReleaseCount) {
          SMPI_Bcast(Stream->ReleaseList,Stream->ReleaseCount << 4,SMPI_BYTE,0,Stream->mpiComm);
          Stream->ReleaseCount = 0;
          free(Stream->ReleaseList);
          Stream->ReleaseList = (_ReleaseRec *)0x0;
        }
      }
    }
    if (Stream->ConfigParams->CPCommPattern != 0) goto LAB_00114334;
    Stream->ReleaseCount = -1;
    SMPI_Bcast(local_c8,1,SMPI_INT,0,Stream->mpiComm);
    Stream->ReleaseCount = 0;
    sVar8 = Stream->ConfigParams->CPCommPattern;
  }
  else if (Stream->Rank == 0) {
    if (0 < Stream->ReleaseCount) {
      if (sVar8 == 0) {
        SMPI_Bcast(&Stream->ReleaseCount,1,SMPI_INT,0,Stream->mpiComm);
        SMPI_Bcast(Stream->ReleaseList,Stream->ReleaseCount << 4,SMPI_BYTE,0,Stream->mpiComm);
      }
      goto LAB_00113fc1;
    }
    goto LAB_00114048;
  }
  if (sVar8 == 0) {
    if (Stream->Rank != 0) {
      while( true ) {
        SMPI_Bcast(local_68,1,SMPI_INT,0,Stream->mpiComm);
        uVar2 = local_68[0];
        if ((ulong)local_68[0] == 0xffffffff) break;
        if (0 < (int)local_68[0]) {
          local_60 = (ReleaseRecPtr)malloc((ulong)local_68[0] << 4);
          SMPI_Bcast(local_60,uVar2 << 4,SMPI_BYTE,0,Stream->mpiComm);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          ProcessReleaseList(Stream,(ReturnMetadataInfo)&CloseTime);
          pthread_mutex_lock((pthread_mutex_t *)__mutex);
          free(local_60);
          local_60 = (ReleaseRecPtr)0x0;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    SMPI_Barrier(Stream->mpiComm);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
  }
LAB_00114334:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  gettimeofday((timeval *)&CloseTime,(__timezone_ptr_t)0x0);
  lVar9 = CloseTime.tv_usec - (Stream->ValidStartTime).tv_usec;
  lVar11 = lVar9 + 1000000;
  if (-1 < lVar9) {
    lVar11 = lVar9;
  }
  (Stream->Stats).StreamValidTimeSecs =
       (double)((lVar9 >> 0x3f) + (CloseTime.tv_sec - (Stream->ValidStartTime).tv_sec)) +
       (double)lVar11 / 1000000.0;
  if (1 < Stream->CPVerbosityLevel) {
    DoStreamSummary(Stream);
  }
  CP_verbose(Stream,PerStepVerbose,"All timesteps are released in WriterClose\n");
  if ((Stream->Rank == 0) && (Stream->RegistrationMethod == SstRegisterFile)) {
    pcVar5 = Stream->AbsoluteFilename;
    unlink(pcVar5);
    ppNVar3 = &FileNameList;
    do {
      ppNVar10 = ppNVar3;
      __ptr_00 = *ppNVar10;
      if (__ptr_00 == (NameListEntry *)0x0) {
        return;
      }
      iVar4 = strcmp(pcVar5,__ptr_00->FileName);
      ppNVar3 = &__ptr_00->Next;
    } while (iVar4 != 0);
    *ppNVar10 = __ptr_00->Next;
    free(__ptr_00);
  }
  return;
}

Assistant:

void SstWriterClose(SstStream Stream)
{
    struct timeval CloseTime, Diff;
    STREAM_MUTEX_LOCK(Stream);
    Stream->CloseTimestepCount = Stream->WriterTimestep;
    if ((Stream->ConfigParams->StepDistributionMode != StepsOnDemand) ||
        (Stream->LastDemandTimestep == Stream->CloseTimestepCount))
    {
        /* send if not OnDemand, or if all timesteps have been send OnDemand */
        SendCloseMsgs(Stream);
    }
    UntagPreciousTimesteps(Stream);
    Stream->ConfigParams->ReserveQueueLimit = 0;
    QueueMaintenance(Stream);

    // sleep briefly to allow for outgoing close messages to arrive
    usleep(100 * 1000);

    if ((Stream->ConfigParams->CPCommPattern == SstCPCommPeer) || (Stream->Rank == 0))
    {
        if (Stream->ReleaseCount > 0)
        {
            if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
            {
                SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                SMPI_Bcast(Stream->ReleaseList,
                           Stream->ReleaseCount * sizeof(*(Stream->ReleaseList)), SMPI_BYTE, 0,
                           Stream->mpiComm);
            }
            Stream->ReleaseCount = 0;
            free(Stream->ReleaseList);
            Stream->ReleaseList = NULL;
        }
        while (Stream->StepRequestQueue)
        {
            StepRequest Request = Stream->StepRequestQueue;
            Stream->StepRequestQueue = Request->Next;
            free(Request);
        }
        while (Stream->QueuedTimesteps)
        {
            CP_verbose(Stream, PerStepVerbose,
                       "Waiting for timesteps to be released in WriterClose\n");
            if (Stream->CPVerbosityLevel >= TraceVerbose)
            {
                CPTimestepList List = Stream->QueuedTimesteps;
                char *StringList = malloc(1);
                StringList[0] = 0;

                while (List)
                {
                    char tmp[30];
                    CP_verbose(Stream, TraceVerbose,
                               "IN TS WAIT, ENTRIES are Timestep %ld (exp %d, "
                               "Prec %d, Ref %d), Count now %d\n",
                               List->Timestep, List->Expired, List->PreciousTimestep,
                               List->ReferenceCount, Stream->QueuedTimestepCount);
                    snprintf(tmp, sizeof(tmp), "%zd ", List->Timestep);
                    StringList = realloc(StringList, strlen(StringList) + strlen(tmp) + 1);
                    strcat(StringList, tmp);
                    List = List->Next;
                }
                CP_verbose(Stream, TraceVerbose, "The timesteps still queued are: %s\n",
                           StringList);
                free(StringList);
            }
            CP_verbose(Stream, TraceVerbose, "Reader Count is %d\n", Stream->ReaderCount);
            for (int i = 0; i < Stream->ReaderCount; i++)
            {
                CP_verbose(Stream, TraceVerbose, "Reader [%d] status is %s\n", i,
                           SSTStreamStatusStr[Stream->Readers[i]->ReaderStatus]);
            }
            /* NEED TO HANDLE FAILURE HERE */
            STREAM_CONDITION_WAIT(Stream);
            if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
            {
                SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                if (Stream->ReleaseCount > 0)
                {
                    SMPI_Bcast(Stream->ReleaseList,
                               Stream->ReleaseCount * sizeof(*(Stream->ReleaseList)), SMPI_BYTE, 0,
                               Stream->mpiComm);
                    Stream->ReleaseCount = 0;
                    free(Stream->ReleaseList);
                    Stream->ReleaseList = NULL;
                }
            }
        }
        if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
        {
            Stream->ReleaseCount = -1;
            SMPI_Bcast(&Stream->ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
            Stream->ReleaseCount = 0;
        }
    }

    if (Stream->ConfigParams->CPCommPattern == SstCPCommMin)
    {
        if (Stream->Rank != 0)
        {
            struct _ReturnMetadataInfo ReleaseData;
            while (1)
            {
                SMPI_Bcast(&ReleaseData.ReleaseCount, 1, SMPI_INT, 0, Stream->mpiComm);
                if (ReleaseData.ReleaseCount == -1)
                {
                    break;
                }
                else if (ReleaseData.ReleaseCount > 0)
                {
                    ReleaseData.ReleaseList =
                        malloc(ReleaseData.ReleaseCount * sizeof(*ReleaseData.ReleaseList));
                    SMPI_Bcast(ReleaseData.ReleaseList,
                               ReleaseData.ReleaseCount * sizeof(*ReleaseData.ReleaseList),
                               SMPI_BYTE, 0, Stream->mpiComm);
                    STREAM_MUTEX_UNLOCK(Stream);
                    ProcessReleaseList(Stream, &ReleaseData);
                    STREAM_MUTEX_LOCK(Stream);
                    free(ReleaseData.ReleaseList);
                    ReleaseData.ReleaseList = NULL;
                }
            }
        }
        /*
         * if we're CommMin, getting here implies that Rank 0 has released all
         * timesteps, other ranks can follow suit after barrier
         */
        STREAM_MUTEX_UNLOCK(Stream);
        SMPI_Barrier(Stream->mpiComm);
        STREAM_MUTEX_LOCK(Stream);
    }
    STREAM_MUTEX_UNLOCK(Stream);
    gettimeofday(&CloseTime, NULL);
    timersub(&CloseTime, &Stream->ValidStartTime, &Diff);
    Stream->Stats.StreamValidTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;

    if (Stream->CPVerbosityLevel >= (int)SummaryVerbose)
    {
        DoStreamSummary(Stream);
    }
    CP_verbose(Stream, PerStepVerbose, "All timesteps are released in WriterClose\n");

    /*
     *  Only rank 0 removes contact info, and only when everything is closed.
     */
    if (Stream->Rank == 0)
    {
        removeContactInfo(Stream);
    }
}